

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O3

bool __thiscall IceCore::Container::Refit(Container *this)

{
  uint uVar1;
  udword *__src;
  udword *__dest;
  ulong uVar2;
  udword uVar3;
  
  uVar3 = mUsedRam + this->mMaxNbEntries * -4;
  uVar1 = this->mCurNbEntries;
  uVar2 = (ulong)uVar1;
  mUsedRam = uVar3;
  this->mMaxNbEntries = uVar1;
  if (uVar2 != 0) {
    __dest = (udword *)operator_new__(uVar2 * 4);
    mUsedRam = uVar3 + uVar1 * 4;
    __src = this->mEntries;
    memcpy(__dest,__src,(ulong)(uVar1 * 4));
    if (__src != (udword *)0x0) {
      operator_delete__(__src);
    }
    this->mEntries = __dest;
  }
  return uVar2 != 0;
}

Assistant:

bool Container::Refit()
{
#ifdef CONTAINER_STATS
	// Subtract previous amount of bytes
	mUsedRam-=mMaxNbEntries*sizeof(udword);
#endif

	// Get just enough entries
	mMaxNbEntries = mCurNbEntries;
	if(!mMaxNbEntries)	return false;

	// Get just enough bytes
	udword*	NewEntries = new udword[mMaxNbEntries];
	CHECKALLOC(NewEntries);

#ifdef CONTAINER_STATS
	// Add current amount of bytes
	mUsedRam+=mMaxNbEntries*sizeof(udword);
#endif

	// Copy old data
	CopyMemory(NewEntries, mEntries, mCurNbEntries*sizeof(udword));

	// Delete old data
	DELETEARRAY(mEntries);

	// Assign new pointer
	mEntries = NewEntries;

	return true;
}